

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WDString.cpp
# Opt level: O0

int index_kmp(string *S,string *T,int *next)

{
  char cVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  int local_68;
  int local_28;
  int local_24;
  int j;
  int i;
  int *next_local;
  string *T_local;
  string *S_local;
  
  local_24 = 1;
  local_28 = 1;
LAB_00103caa:
  do {
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                      (S);
    bVar2 = false;
    if ((ulong)(long)local_24 <= sVar3) {
      sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              length(T);
      bVar2 = (ulong)(long)local_28 <= sVar3;
    }
    if (!bVar2) {
      sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              length(T);
      if (sVar3 < (ulong)(long)local_28) {
        sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                length(T);
        local_68 = local_24 - (int)sVar3;
      }
      else {
        local_68 = 0;
      }
      return local_68;
    }
    if (local_28 != 0) {
      pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](S,(long)local_24);
      cVar1 = *pvVar4;
      pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](T,(long)local_24);
      if (cVar1 != *pvVar4) {
        local_28 = next[local_28];
        goto LAB_00103caa;
      }
    }
    local_24 = local_24 + 1;
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

int index_kmp(string S,string T,int next[])
{
    int i = 1, j = 1;
    while(i<=S.length() && j <=T.length())
    {
        if(j==0||S[i]==T[i])
        {
            ++i; ++j;
        }
        else j = next[j];
    }
    return (j>T.length()? i-T.length():0);
}